

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<double>(double t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte in_SIL;
  undefined7 in_register_00000039;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_65 [13];
  Any local_58;
  Any local_50 [3];
  element_type *local_38;
  element_type *ptr;
  shared_ptr<double> p;
  bool t_return_value_local;
  double t_local;
  
  p.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = in_SIL & 1;
  std::make_shared<double,double>((double *)&ptr);
  local_38 = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)&ptr);
  detail::Get_Type_Info<double>::get();
  detail::Any::Any<std::shared_ptr<double>,void>(&local_58,(shared_ptr<double> *)&ptr);
  local_65[0] = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,double*&,bool&>
            ((Type_Info *)CONCAT71(in_register_00000039,t_return_value),local_50,(bool *)&local_58,
             (double **)local_65,(bool *)&local_38);
  detail::Any::~Any(&local_58);
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)&ptr);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT71(in_register_00000039,t_return_value);
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }